

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dosbox_opl3.cpp
# Opt level: O0

void __thiscall DosBoxOPL3::DosBoxOPL3(DosBoxOPL3 *this)

{
  Handler *this_00;
  DosBoxOPL3 *this_local;
  
  OPLChipBaseBufferedT<DosBoxOPL3,_256U>::OPLChipBaseBufferedT
            (&this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>);
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
  super_OPLChipBase._vptr_OPLChipBase = (_func_int **)&PTR__DosBoxOPL3_002f9148;
  this_00 = (Handler *)operator_new(0x11b0);
  DBOPL::Handler::Handler(this_00);
  this->m_chip = this_00;
  reset(this);
  return;
}

Assistant:

DosBoxOPL3::DosBoxOPL3() :
    OPLChipBaseBufferedT(),
    m_chip(new DBOPL::Handler)
{
    DosBoxOPL3::reset();
}